

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<kj::Directory,_std::nullptr_t> __thiscall
kj::newInMemoryDirectory(kj *this,Clock *clock,InMemoryFileFactory *fileFactory)

{
  undefined8 *puVar1;
  AtomicRefcounted *refcounted;
  undefined1 auVar2 [16];
  Own<kj::Directory,_std::nullptr_t> OVar3;
  
  puVar1 = (undefined8 *)operator_new(0x78);
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = &PTR_getFd_0028fe28;
  puVar1[1] = &DAT_0028ff00;
  _::Mutex::Mutex((Mutex *)(puVar1 + 3));
  puVar1[6] = clock;
  puVar1[7] = fileFactory;
  *(undefined4 *)(puVar1 + 9) = 0;
  puVar1[10] = 0;
  puVar1[0xb] = puVar1 + 9;
  puVar1[0xc] = puVar1 + 9;
  puVar1[0xd] = 0;
  auVar2 = (*(code *)**(undefined8 **)clock)(clock);
  OVar3.ptr = auVar2._8_8_;
  puVar1[0xe] = auVar2._0_8_;
  LOCK();
  *(int *)(puVar1 + 2) = *(int *)(puVar1 + 2) + 1;
  UNLOCK();
  *(undefined8 **)this = puVar1 + 1;
  *(undefined8 **)(this + 8) = puVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<Directory> newInMemoryDirectory(const Clock& clock, const InMemoryFileFactory& fileFactory) {
  return atomicRefcounted<InMemoryDirectory>(clock, fileFactory);
}